

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall
r_exec::Group::inject_hlps
          (Group *this,vector<r_exec::View_*,_std::allocator<r_exec::View_*>_> *views)

{
  _Object *p_Var1;
  View *pVVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  DebugStream *pDVar7;
  undefined4 extraout_var_00;
  mapped_type *pmVar8;
  MDLController *c;
  Group *pGVar9;
  undefined4 extraout_var_01;
  CSTController *this_00;
  uint64_t ijt;
  _Rb_tree_node_base *p_Var10;
  pointer ppVVar11;
  pointer ppVVar12;
  undefined1 auVar13 [16];
  Atom a;
  bool inject_in_secondary_group;
  allocator local_d1;
  pthread_mutex_t *local_d0;
  undefined4 local_c4;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70 [32];
  string local_50 [32];
  
  local_d0 = (pthread_mutex_t *)&this->mutex;
  std::mutex::lock((mutex *)&local_d0->__data);
  local_c0._8_8_ = &this->ipgm_views;
  for (ppVVar11 = (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      ppVVar11 !=
      (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppVVar11 = ppVVar11 + 1) {
    p_Var1 = ((*ppVVar11)->super_View).object.object;
    iVar5 = (*p_Var1->_vptr__Object[4])(p_Var1,0);
    local_c4 = *(undefined4 *)CONCAT44(extraout_var,iVar5);
    cVar3 = r_code::Atom::getDescriptor();
    if (cVar3 == -0x33) {
      std::__cxx11::string::string(local_50,"group inject hlp",&local_d1);
      ::debug((string *)local_c0);
      lVar6 = (*Now)();
      auVar13 = r_code::Utils::GetTimeReference();
      DebugStream::timestamp_abi_cxx11_
                (&local_90,(DebugStream *)(lVar6 - auVar13._0_8_),auVar13._8_8_);
      pDVar7 = DebugStream::operator<<((DebugStream *)local_c0,&local_90);
      pDVar7 = DebugStream::operator<<(pDVar7," -> cst ");
      iVar5 = (*(((*ppVVar11)->super_View).object.object)->_vptr__Object[2])();
      DebugStream::operator<<(pDVar7,CONCAT44(extraout_var_01,iVar5));
      std::__cxx11::string::~string((string *)&local_90);
      DebugStream::~DebugStream((DebugStream *)local_c0);
      std::__cxx11::string::~string(local_50);
      pVVar2 = *ppVVar11;
      local_c0._0_8_ = View::get_oid(pVVar2);
      pmVar8 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_c0._8_8_,(key_type *)local_c0);
      core::P<r_exec::View>::operator=(pmVar8,pVVar2);
      this_00 = (CSTController *)operator_new(0x1e8);
      CSTController::CSTController(this_00,&(*ppVVar11)->super_View);
      core::P<r_exec::Controller>::operator=(&(*ppVVar11)->controller,(Controller *)this_00);
      pGVar9 = get_secondary_group(this);
      CSTController::set_secondary_host(this_00,pGVar9);
    }
    else if (cVar3 == -0x32) {
      std::__cxx11::string::string(local_70,"group inject hlp",&local_d1);
      ::debug((string *)local_c0);
      lVar6 = (*Now)();
      auVar13 = r_code::Utils::GetTimeReference();
      DebugStream::timestamp_abi_cxx11_
                ((string *)(local_c0 + 0x10),(DebugStream *)(lVar6 - auVar13._0_8_),auVar13._8_8_);
      pDVar7 = DebugStream::operator<<((DebugStream *)local_c0,(string *)(local_c0 + 0x10));
      pDVar7 = DebugStream::operator<<(pDVar7," -> mdl ");
      iVar5 = (*(((*ppVVar11)->super_View).object.object)->_vptr__Object[2])();
      DebugStream::operator<<(pDVar7,CONCAT44(extraout_var_00,iVar5));
      std::__cxx11::string::~string((string *)(local_c0 + 0x10));
      DebugStream::~DebugStream((DebugStream *)local_c0);
      std::__cxx11::string::~string(local_70);
      pVVar2 = *ppVVar11;
      local_c0._0_8_ = View::get_oid(pVVar2);
      pmVar8 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_c0._8_8_,(key_type *)local_c0);
      core::P<r_exec::View>::operator=(pmVar8,pVVar2);
      c = MDLController::New(*ppVVar11,(bool *)local_c0);
      core::P<r_exec::Controller>::operator=(&(*ppVVar11)->controller,(Controller *)c);
      if (local_c0[0] == '\x01') {
        pGVar9 = get_secondary_group(this);
        inject_secondary_mdl_controller(pGVar9,*ppVVar11);
      }
    }
    pVVar2 = *ppVVar11;
    ijt = (*Now)();
    r_code::View::set_ijt(&pVVar2->super_View,ijt);
    r_code::Atom::~Atom((Atom *)&local_c4);
  }
  for (ppVVar12 = (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>).
                  _M_impl.super__Vector_impl_data._M_start; ppVVar12 != ppVVar11;
      ppVVar12 = ppVVar12 + 1) {
    bVar4 = is_active_pgm(this,*ppVVar12);
    if (bVar4) {
      (*(((*ppVVar12)->controller).object)->_vptr__Object[5])();
      for (p_Var10 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left;
          (_Rb_tree_header *)p_Var10 !=
          &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        Controller::_take_input
                  ((Controller *)((*ppVVar12)->controller).object,*(View **)(p_Var10 + 1));
      }
    }
    ppVVar11 = (views->super__Vector_base<r_exec::View_*,_std::allocator<r_exec::View_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
  }
  pthread_mutex_unlock(local_d0);
  return;
}

Assistant:

void Group::inject_hlps(std::vector<View *> &views)
{
    std::lock_guard<std::mutex> guard(mutex);
    std::vector<View *>::const_iterator view;

    for (view = views.begin(); view != views.end(); ++view) {
        Atom a = (*view)->object->code(0);

        switch (a.getDescriptor()) {
        case Atom::COMPOSITE_STATE: {
            debug("group inject hlp") << DebugStream::timestamp(Now() - Utils::GetTimeReference()) << " -> cst " << (*view)->object->get_oid();
            ipgm_views[(*view)->get_oid()] = *view;
            CSTController *c = new CSTController(*view);
            (*view)->controller = c;
            c->set_secondary_host(get_secondary_group());
            break;
        }

        case Atom::MODEL: {
            debug("group inject hlp") << DebugStream::timestamp(Now() - Utils::GetTimeReference()) << " -> mdl " << (*view)->object->get_oid();
            ipgm_views[(*view)->get_oid()] = *view;
            bool inject_in_secondary_group;
            MDLController *c = MDLController::New(*view, inject_in_secondary_group);
            (*view)->controller = c;

            if (inject_in_secondary_group) {
                get_secondary_group()->inject_secondary_mdl_controller(*view);
            }

            break;
        }
        }

        (*view)->set_ijt(Now());
    }

    for (view = views.begin(); view != views.end(); ++view) {
        if (is_active_pgm(*view)) {
            (*view)->controller->gain_activation();
            std::multiset<P<View>, r_code::View::Less>::const_iterator v;

            for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
                (*view)->controller->_take_input(*v);    // view will be copied.
            }
        }
    }
}